

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O2

void JSONWorker::DoNode(internalJSONNode *parent,json_string *value_t)

{
  size_type sVar1;
  pointer pcVar2;
  size_t pos;
  size_t sVar3;
  allocator local_79;
  internalJSONNode *local_78;
  json_string name;
  json_string local_50;
  
  sVar1 = value_t->_M_string_length;
  local_78 = parent;
  std::__cxx11::string::string((string *)&name,"DoNode is empty",(allocator *)&local_50);
  JSONDebug::_JSON_ASSERT(sVar1 != 0,&name);
  std::__cxx11::string::~string((string *)&name);
  if (*(value_t->_M_dataplus)._M_p == '{') {
    if (value_t->_M_string_length < 3) {
      return;
    }
    pos = FindNextRelevant<(char)58>(value_t,1);
    if (pos != 0xffffffffffffffff) {
      pcVar2 = (value_t->_M_dataplus)._M_p;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      std::__cxx11::string::
      _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((string *)&name,pcVar2 + 1,pcVar2 + (pos - 1));
      sVar3 = FindNextRelevant<(char)44>(value_t,pos);
      do {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        if (sVar3 == 0xffffffffffffffff) {
          pcVar2 = (value_t->_M_dataplus)._M_p;
          std::__cxx11::string::
          _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    ((string *)&local_50,pcVar2 + pos + 1,pcVar2 + (value_t->_M_string_length - 1));
          NewNode(local_78,&name,&local_50,false);
          std::__cxx11::string::~string((string *)&local_50);
LAB_00113bd4:
          std::__cxx11::string::~string((string *)&name);
          return;
        }
        pcVar2 = (value_t->_M_dataplus)._M_p;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)&local_50,pcVar2 + pos + 1,pcVar2 + sVar3);
        NewNode(local_78,&name,&local_50,false);
        std::__cxx11::string::~string((string *)&local_50);
        pos = FindNextRelevant<(char)58>(value_t,sVar3 + 1);
        if (pos == 0xffffffffffffffff) {
          std::__cxx11::string::string((string *)&local_50,"Missing :",&local_79);
          JSONDebug::_JSON_FAIL(&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          internalJSONNode::Nullify(local_78);
          goto LAB_00113bd4;
        }
        pcVar2 = (value_t->_M_dataplus)._M_p;
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)&name,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar2 + sVar3 + 1),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(pcVar2 + (pos - 1)));
        sVar3 = FindNextRelevant<(char)44>(value_t,pos);
      } while( true );
    }
    std::__cxx11::string::string((string *)&name,"Missing :",(allocator *)&local_50);
  }
  else {
    std::__cxx11::string::string((string *)&name,"DoNode is not an node",(allocator *)&local_50);
  }
  JSONDebug::_JSON_FAIL(&name);
  std::__cxx11::string::~string((string *)&name);
  internalJSONNode::Nullify(local_78);
  return;
}

Assistant:

void JSONWorker::DoNode(const internalJSONNode * parent, const json_string & value_t) json_nothrow {	
	//This take a node and creates its members and such
	JSON_ASSERT(!value_t.empty(), JSON_TEXT("DoNode is empty"));
	JSON_ASSERT_SAFE(value_t[0] == JSON_TEXT('{'), JSON_TEXT("DoNode is not an node"), parent -> Nullify(); return;);
	if (json_unlikely(value_t.length() <= 2)) return;  // just a {} (blank node)
	
	size_t name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, 1);  //find where the name ends
	JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
	json_string name(value_t.begin() + 1, value_t.begin() + name_ending - 1);	  //pull the name out
	for (size_t value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending),  //find the end of the value
		 name_starting = 1;  //ignore the {
		 value_ending != json_string::npos;
		 value_ending = FIND_NEXT_RELEVANT(JSON_TEXT(','), value_t, name_ending)){
		
		NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.begin() + value_ending), false);
		name_starting = value_ending + 1;
		name_ending = FIND_NEXT_RELEVANT(JSON_TEXT(':'), value_t, name_starting);
		JSON_ASSERT_SAFE(name_ending != json_string::npos, JSON_TEXT("Missing :"), parent -> Nullify(); return;);
		name.assign(value_t.begin() + name_starting, value_t.begin() + name_ending - 1);
	}
	//since the last one will not find the comma, we have to add it here
	NewNode(parent, name, json_string(value_t.begin() + name_ending + 1, value_t.end() - 1), false);
}